

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireEmptyHandTest_tryAddCardsOnTableauPile_Test::TestBody
          (SolitaireEmptyHandTest_tryAddCardsOnTableauPile_Test *this)

{
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_00;
  TableauPileMock *mock_obj;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_01;
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_02;
  Cards *pCVar1;
  Solitaire *this_03;
  char *in_R9;
  bool bVar2;
  AssertHelper AStack_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [8];
  VTable *local_30;
  PileId local_1c;
  
  mock_obj = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock;
  this_00 = &mock_obj->gmock00_createSnapshot_13;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_58._0_8_ = this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
            ::InternalExpectedAt
                      ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                        *)local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x141,"lastTableauPileMock","createSnapshot()");
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::Times(this_01,0);
  local_30 = (VTable *)
             testing::internal::
             MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>
             ::
             GetVTable<testing::internal::MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  local_38 = (undefined1  [8])&PTR__MatcherBase_0031bfc8;
  piles::TableauPileMock::gmock_tryAddCards
            ((MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
              *)local_58,
             (this->super_SolitaireEmptyHandTest).super_SolitaireTest.lastTableauPileMock,
             (Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
              *)local_38);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
                        *)local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x142,"lastTableauPileMock","tryAddCards(_)");
  testing::internal::
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  ::Times(this_02,0);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)(local_58 + 8));
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)local_38);
  this_03 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  local_1c.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryAddCardsOnTableauPile(this_03,&local_1c);
  pCVar1 = Solitaire::getCardsInHand(this_03);
  bVar2 = (pCVar1->
          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pCVar1->
          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
          _M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = bVar2;
  local_30 = (VTable *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_38,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x145,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
    if (local_30 != (VTable *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    }
  }
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryAddCardsOnTableauPile) {
    EXPECT_CALL(lastTableauPileMock, createSnapshot()).Times(0);
    EXPECT_CALL(lastTableauPileMock, tryAddCards(_)).Times(0);

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}